

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::deleteFramebuffers
          (ReferenceContext *this,int numFramebuffers,deUint32 *framebuffers)

{
  Framebuffer *framebuffer;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)numFramebuffers;
  if (numFramebuffers < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    if (framebuffers[uVar1] != 0) {
      framebuffer = rc::ObjectManager<sglr::rc::Framebuffer>::find
                              (&this->m_framebuffers,framebuffers[uVar1]);
      if (framebuffer != (Framebuffer *)0x0) {
        deleteFramebuffer(this,framebuffer);
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::deleteFramebuffers (int numFramebuffers, const deUint32* framebuffers)
{
	for (int i = 0; i < numFramebuffers; i++)
	{
		deUint32		name		= framebuffers[i];
		Framebuffer*	framebuffer	= name ? m_framebuffers.find(name) : DE_NULL;

		if (framebuffer)
			deleteFramebuffer(framebuffer);
	}
}